

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sr::anon_unknown_0::TextureQueryLodInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureQueryLodInstance *this)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  TestContext *this_00;
  MessageBuilder *pMVar4;
  float *pfVar5;
  allocator<char> local_6c1;
  string local_6c0;
  MessageBuilder local_6a0;
  MessageBuilder local_520;
  allocator<char> local_399;
  string local_398;
  MessageBuilder local_378;
  float local_1f8;
  float local_1f4;
  float resLod;
  float resLevel;
  undefined1 local_1c8 [8];
  Vec4 output;
  TextureLevel *result;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  TextureQueryLodInstance *this_local;
  
  log = (TestLog *)this;
  this_local = (TextureQueryLodInstance *)__return_storage_ptr__;
  this_00 = Context::getTestContext
                      ((this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.
                       super_TestInstance.m_context);
  local_20 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [26])"Expected: level in range ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_levelBounds);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])", lod in range ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_lodBounds);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  TextureQueryInstance::render(&this->super_TextureQueryInstance);
  output.m_data._8_8_ = ShaderRenderCaseInstance::getResultImage((ShaderRenderCaseInstance *)this);
  tcu::TextureLevel::getAccess
            ((ConstPixelBufferAccess *)&resLod,(TextureLevel *)output.m_data._8_8_);
  tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_1c8,(int)&resLod,0,0);
  local_1f4 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_1c8);
  local_1f8 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_1c8);
  fVar2 = local_1f4;
  pfVar5 = tcu::Vector<float,_2>::operator[](&this->m_levelBounds,0);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_2>::operator[](&this->m_levelBounds,1);
  bVar3 = de::inRange<float>(fVar2,fVar1,*pfVar5);
  fVar1 = local_1f8;
  if (bVar3) {
    pfVar5 = tcu::Vector<float,_2>::operator[](&this->m_lodBounds,0);
    fVar2 = *pfVar5;
    pfVar5 = tcu::Vector<float,_2>::operator[](&this->m_lodBounds,1);
    bVar3 = de::inRange<float>(fVar1,fVar2,*pfVar5);
    if (bVar3) {
      tcu::TestLog::operator<<(&local_378,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_378,(char (*) [7])"Passed");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_378);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"Pass",&local_399);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator(&local_399);
      return __return_storage_ptr__;
    }
  }
  tcu::TestLog::operator<<(&local_520,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_520,(char (*) [16])"Result: level: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f4);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [8])", lod: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f8);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_520);
  tcu::TestLog::operator<<(&local_6a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_6a0,(char (*) [7])"Failed");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"Got unexpected result",&local_6c1);
  tcu::TestStatus::fail(__return_storage_ptr__,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureQueryLodInstance::iterate (void)
{
	tcu::TestLog&		log		= m_context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Expected: level in range " << m_levelBounds << ", lod in range " << m_lodBounds << tcu::TestLog::EndMessage;

	// render
	TextureQueryInstance::render();

	// test
	{
		const tcu::TextureLevel&	result		= getResultImage();
		const tcu::Vec4				output		= result.getAccess().getPixel(0, 0);
		const float					resLevel	= output.x();
		const float					resLod		= output.y();

		if (de::inRange(resLevel, m_levelBounds[0], m_levelBounds[1]) && de::inRange(resLod, m_lodBounds[0], m_lodBounds[1]))
		{
			// success
			log << tcu::TestLog::Message << "Passed" << tcu::TestLog::EndMessage;
			return tcu::TestStatus::pass("Pass");
		}
		else
		{
			// failure
			log << tcu::TestLog::Message << "Result: level: " << resLevel << ", lod: " << resLod << tcu::TestLog::EndMessage;
			log << tcu::TestLog::Message << "Failed" << tcu::TestLog::EndMessage;
			return tcu::TestStatus::fail("Got unexpected result");
		}
	}
}